

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int areBlanks(xmlParserCtxtPtr ctxt,xmlChar *str,int len,int blank_chars)

{
  int iVar1;
  xmlNodePtr node;
  xmlNodePtr lastChild;
  int ret;
  int i;
  int blank_chars_local;
  int len_local;
  xmlChar *str_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->sax->ignorableWhitespace == ctxt->sax->characters) {
    ctxt_local._4_4_ = 0;
  }
  else if (((ctxt->space == (int *)0x0) || (*ctxt->space == 1)) || (*ctxt->space == -2)) {
    ctxt_local._4_4_ = 0;
  }
  else {
    if (blank_chars == 0) {
      for (lastChild._4_4_ = 0; lastChild._4_4_ < len; lastChild._4_4_ = lastChild._4_4_ + 1) {
        if (((str[lastChild._4_4_] != ' ') &&
            ((str[lastChild._4_4_] < 9 || (10 < str[lastChild._4_4_])))) &&
           (str[lastChild._4_4_] != '\r')) {
          return 0;
        }
      }
    }
    if (ctxt->node == (xmlNodePtr)0x0) {
      ctxt_local._4_4_ = 0;
    }
    else {
      if (ctxt->myDoc != (xmlDocPtr)0x0) {
        iVar1 = xmlIsMixedElement(ctxt->myDoc,ctxt->node->name);
        if (iVar1 == 0) {
          return 1;
        }
        if (iVar1 == 1) {
          return 0;
        }
      }
      if ((*ctxt->input->cur == '<') || (*ctxt->input->cur == '\r')) {
        if ((ctxt->node->children == (_xmlNode *)0x0) &&
           ((*ctxt->input->cur == '<' && (ctxt->input->cur[1] == '/')))) {
          ctxt_local._4_4_ = 0;
        }
        else {
          node = xmlGetLastChild(ctxt->node);
          if (node == (xmlNodePtr)0x0) {
            if ((ctxt->node->type != XML_ELEMENT_NODE) && (ctxt->node->content != (xmlChar *)0x0)) {
              return 0;
            }
          }
          else {
            iVar1 = xmlNodeIsText(node);
            if (iVar1 != 0) {
              return 0;
            }
            if ((ctxt->node->children != (_xmlNode *)0x0) &&
               (iVar1 = xmlNodeIsText(ctxt->node->children), iVar1 != 0)) {
              return 0;
            }
          }
          ctxt_local._4_4_ = 1;
        }
      }
      else {
        ctxt_local._4_4_ = 0;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int areBlanks(xmlParserCtxtPtr ctxt, const xmlChar *str, int len,
                     int blank_chars) {
    int i, ret;
    xmlNodePtr lastChild;

    /*
     * Don't spend time trying to differentiate them, the same callback is
     * used !
     */
    if (ctxt->sax->ignorableWhitespace == ctxt->sax->characters)
	return(0);

    /*
     * Check for xml:space value.
     */
    if ((ctxt->space == NULL) || (*(ctxt->space) == 1) ||
        (*(ctxt->space) == -2))
	return(0);

    /*
     * Check that the string is made of blanks
     */
    if (blank_chars == 0) {
	for (i = 0;i < len;i++)
	    if (!(IS_BLANK_CH(str[i]))) return(0);
    }

    /*
     * Look if the element is mixed content in the DTD if available
     */
    if (ctxt->node == NULL) return(0);
    if (ctxt->myDoc != NULL) {
	ret = xmlIsMixedElement(ctxt->myDoc, ctxt->node->name);
        if (ret == 0) return(1);
        if (ret == 1) return(0);
    }

    /*
     * Otherwise, heuristic :-\
     */
    if ((RAW != '<') && (RAW != 0xD)) return(0);
    if ((ctxt->node->children == NULL) &&
	(RAW == '<') && (NXT(1) == '/')) return(0);

    lastChild = xmlGetLastChild(ctxt->node);
    if (lastChild == NULL) {
        if ((ctxt->node->type != XML_ELEMENT_NODE) &&
            (ctxt->node->content != NULL)) return(0);
    } else if (xmlNodeIsText(lastChild))
        return(0);
    else if ((ctxt->node->children != NULL) &&
             (xmlNodeIsText(ctxt->node->children)))
        return(0);
    return(1);
}